

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::MergeFrom
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  ulong uVar1;
  LogMessage *other;
  Value *pVVar2;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x21ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) &&
     (from->key_ != (Value *)0x0)) {
    if (this->key_ == (Value *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pVVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>
                         (pAVar4);
      this->key_ = pVVar2;
    }
    puVar3 = (undefined1 *)from->key_;
    if ((Value *)puVar3 == (Value *)0x0) {
      puVar3 = _Value_default_instance_;
    }
    Value::MergeFrom(this->key_,(Value *)puVar3);
  }
  if ((from != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) &&
     (from->value_ != (Value *)0x0)) {
    if (this->value_ == (Value *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pVVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>
                         (pAVar4);
      this->value_ = pVVar2;
    }
    puVar3 = (undefined1 *)from->value_;
    if ((Value *)puVar3 == (Value *)0x0) {
      puVar3 = _Value_default_instance_;
    }
    Value::MergeFrom(this->value_,(Value *)puVar3);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void DictionaryValue_KeyValuePair::MergeFrom(const DictionaryValue_KeyValuePair& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_key()) {
    _internal_mutable_key()->::CoreML::Specification::MILSpec::Value::MergeFrom(from._internal_key());
  }
  if (from._internal_has_value()) {
    _internal_mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from._internal_value());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}